

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
pegmatite::AsciiFileInput::AsciiFileInput(AsciiFileInput *this,int file,string *name)

{
  pointer pcVar1;
  int iVar2;
  stat buf;
  stat local_a0;
  
  (this->super_Input)._vptr_Input = (_func_int **)&PTR___cxa_pure_virtual_00157ac0;
  (this->super_Input).user_name._M_dataplus._M_p = (pointer)&(this->super_Input).user_name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Input).user_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Input).buffer = (char32_t *)0x0;
  (this->super_Input).buffer_start = 1;
  (this->super_Input).buffer_end = 0;
  (this->super_Input)._vptr_Input = (_func_int **)&PTR_fillBuffer_00157af0;
  this->fd = file;
  iVar2 = fstat(file,&local_a0);
  if (iVar2 == 0) {
    this->file_size = local_a0.st_size;
    return;
  }
  this->file_size = 0;
  perror("Input error");
  return;
}

Assistant:

AsciiFileInput::AsciiFileInput(int file, const std::string& name)
	: Input(name), fd(file)
{
	struct stat buf;
	if (fstat(fd, &buf) != 0)
	{
		file_size = 0;
		perror("Input error");
	}
	else
	{
		file_size = static_cast<Index>(buf.st_size);
	}
}